

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O3

void __thiscall Assimp::ArmaturePopulate::Execute(ArmaturePopulate *this,aiScene *out)

{
  long lVar1;
  Logger *pLVar2;
  aiNode *paVar3;
  _Base_ptr p_Var4;
  aiNode *paVar5;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
  bone_stack;
  long *local_238;
  long local_228 [2];
  vector<aiNode_*,_std::allocator<aiNode_*>_> local_218;
  vector<aiBone_*,_std::allocator<aiBone_*>_> local_1f8;
  char *local_1e0;
  _Rb_tree<aiBone_*,_std::pair<aiBone_*const,_aiNode_*>,_std::_Select1st<std::pair<aiBone_*const,_aiNode_*>_>,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  local_1f8.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_218.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  BuildBoneList(out->mRootNode,out->mRootNode,out,&local_1f8);
  paVar5 = out->mRootNode;
  BuildNodeList(paVar5,&local_218);
  BuildBoneStack(paVar5,out->mRootNode,out,&local_1f8,
                 (map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
                  *)&local_1d8,&local_218);
  pLVar2 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[18]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [18])"Bone stack size: ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar2,(char *)local_238);
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((_Rb_tree_header *)local_1d8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1d8._M_impl.super__Rb_tree_header) {
    p_Var4 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      lVar1 = *(long *)(p_Var4 + 1);
      paVar5 = (aiNode *)p_Var4[1]._M_parent;
      pLVar2 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[21]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [21])"active node lookup: ");
      local_1e0 = (char *)(lVar1 + 4);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                 &local_1e0);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar2,(char *)local_238);
      if (local_238 != local_228) {
        operator_delete(local_238,local_228[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      paVar3 = GetArmatureRoot(paVar5,&local_1f8);
      if (paVar3 == (aiNode *)0x0) {
        __assert_fail("armature",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                      ,0x5a,"virtual void Assimp::ArmaturePopulate::Execute(aiScene *)");
      }
      *(aiNode **)(lVar1 + 0x408) = paVar3;
      if (paVar5 == (aiNode *)0x0) {
        __assert_fail("bone_node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                      ,0x60,"virtual void Assimp::ArmaturePopulate::Execute(aiScene *)");
      }
      *(aiNode **)(lVar1 + 0x410) = paVar5;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &local_1d8._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<aiBone_*,_std::pair<aiBone_*const,_aiNode_*>,_std::_Select1st<std::pair<aiBone_*const,_aiNode_*>_>,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
  ::~_Rb_tree(&local_1d8);
  if (local_218.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ArmaturePopulate::Execute(aiScene *out) {

  // Now convert all bone positions to the correct mOffsetMatrix
  std::vector<aiBone *> bones;
  std::vector<aiNode *> nodes;
  std::map<aiBone *, aiNode *> bone_stack;
  BuildBoneList(out->mRootNode, out->mRootNode, out, bones);
  BuildNodeList(out->mRootNode, nodes);

  BuildBoneStack(out->mRootNode, out->mRootNode, out, bones, bone_stack, nodes);

  ASSIMP_LOG_DEBUG_F("Bone stack size: ", bone_stack.size());

  for (std::pair<aiBone *, aiNode *> kvp : bone_stack) {
    aiBone *bone = kvp.first;
    aiNode *bone_node = kvp.second;
    ASSIMP_LOG_DEBUG_F("active node lookup: ", bone->mName.C_Str());
    // lcl transform grab - done in generate_nodes :)

    // bone->mOffsetMatrix = bone_node->mTransformation;
    aiNode *armature = GetArmatureRoot(bone_node, bones);

    ai_assert(armature);

    // set up bone armature id
    bone->mArmature = armature;

    // set this bone node to be referenced properly
    ai_assert(bone_node);
    bone->mNode = bone_node;
  }
}